

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O2

void flow::dumpArrays<flow::util::Cidr>
               (vector<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
                *vv,char *name)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pCVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  Cidr *in_R8;
  long lVar9;
  string_view format_str;
  string local_50;
  
  if ((vv->
      super__Vector_base<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (vv->
      super__Vector_base<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n; Constant ");
    poVar6 = std::operator<<(poVar6,name);
    std::operator<<(poVar6," Arrays\n");
    pvVar1 = (vv->
             super__Vector_base<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pvVar2 = (vv->
             super__Vector_base<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; lVar8 != ((long)pvVar1 - (long)pvVar2) / 0x18; lVar8 = lVar8 + 1) {
      pvVar3 = (vv->
               super__Vector_base<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>,_std::allocator<std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar6 = std::operator<<((ostream *)&std::cout,".const array<");
      poVar6 = std::operator<<(poVar6,name);
      poVar6 = std::operator<<(poVar6,"> ");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," = [");
      pCVar4 = *(pointer *)
                ((long)&pvVar3[lVar8].
                        super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
                        _M_impl.super__Vector_impl_data + 8);
      lVar5 = *(long *)&pvVar3[lVar8].
                        super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
                        _M_impl.super__Vector_impl_data;
      lVar7 = 0;
      for (lVar9 = 0; ((long)pCVar4 - lVar5) / 0x50 != lVar9; lVar9 = lVar9 + 1) {
        if (lVar9 != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        format_str.size_ =
             *(long *)&pvVar3[lVar8].
                       super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
                       _M_impl.super__Vector_impl_data + lVar7;
        format_str.data_ = (char *)0x2;
        fmt::v5::format<flow::util::Cidr>(&local_50,(v5 *)0x165bdf,format_str,in_R8);
        std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        lVar7 = lVar7 + 0x50;
      }
      std::operator<<((ostream *)&std::cout,"];\n");
    }
  }
  return;
}

Assistant:

void dumpArrays(const std::vector<std::vector<T>>& vv, const char* name) {
  if (vv.empty()) return;

  std::cout << "\n; Constant " << name << " Arrays\n";
  for (size_t i = 0, e = vv.size(); i != e; ++i) {
    const auto& array = vv[i];
    std::cout << ".const array<" << name << "> " << std::setw(3) << i << " = [";
    for (size_t k = 0, m = array.size(); k != m; ++k) {
      if (k) std::cout << ", ";
      std::cout << fmt::format("{}", array[k]);
    }
    std::cout << "];\n";
  }
}